

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

int __thiscall re2::RE2::Options::ParseFlags(Options *this)

{
  bool bVar1;
  Encoding EVar2;
  LogMessage *this_00;
  ostream *this_01;
  Options *in_RDI;
  int flags;
  int in_stack_fffffffffffffe74;
  char *in_stack_fffffffffffffe78;
  LogMessage *in_stack_fffffffffffffe80;
  uint local_c;
  
  local_c = 4;
  EVar2 = encoding(in_RDI);
  if (EVar2 != EncodingUTF8) {
    if (EVar2 == EncodingLatin1) {
      local_c = 0x24;
    }
    else {
      bVar1 = log_errors(in_RDI);
      if (bVar1) {
        LogMessage::LogMessage
                  (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
        this_00 = (LogMessage *)LogMessage::stream((LogMessage *)&stack0xfffffffffffffe70);
        this_01 = std::operator<<((ostream *)this_00,"Unknown encoding ");
        EVar2 = encoding(in_RDI);
        std::ostream::operator<<(this_01,EVar2);
        LogMessage::~LogMessage(this_00);
      }
    }
  }
  bVar1 = posix_syntax(in_RDI);
  if (!bVar1) {
    local_c = local_c | 0x794;
  }
  bVar1 = literal(in_RDI);
  if (bVar1) {
    local_c = local_c | 2;
  }
  bVar1 = never_nl(in_RDI);
  if (bVar1) {
    local_c = local_c | 0x800;
  }
  bVar1 = dot_nl(in_RDI);
  if (bVar1) {
    local_c = local_c | 8;
  }
  bVar1 = never_capture(in_RDI);
  if (bVar1) {
    local_c = local_c | 0x1000;
  }
  bVar1 = case_sensitive(in_RDI);
  if (!bVar1) {
    local_c = local_c | 1;
  }
  bVar1 = perl_classes(in_RDI);
  if (bVar1) {
    local_c = local_c | 0x80;
  }
  bVar1 = word_boundary(in_RDI);
  if (bVar1) {
    local_c = local_c | 0x100;
  }
  bVar1 = one_line(in_RDI);
  if (bVar1) {
    local_c = local_c | 0x10;
  }
  return local_c;
}

Assistant:

int RE2::Options::ParseFlags() const {
  int flags = Regexp::ClassNL;
  switch (encoding()) {
    default:
      if (log_errors())
        LOG(ERROR) << "Unknown encoding " << encoding();
      break;
    case RE2::Options::EncodingUTF8:
      break;
    case RE2::Options::EncodingLatin1:
      flags |= Regexp::Latin1;
      break;
  }

  if (!posix_syntax())
    flags |= Regexp::LikePerl;

  if (literal())
    flags |= Regexp::Literal;

  if (never_nl())
    flags |= Regexp::NeverNL;

  if (dot_nl())
    flags |= Regexp::DotNL;

  if (never_capture())
    flags |= Regexp::NeverCapture;

  if (!case_sensitive())
    flags |= Regexp::FoldCase;

  if (perl_classes())
    flags |= Regexp::PerlClasses;

  if (word_boundary())
    flags |= Regexp::PerlB;

  if (one_line())
    flags |= Regexp::OneLine;

  return flags;
}